

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  bool bVar1;
  byte bVar2;
  CppType CVar3;
  Descriptor *this_00;
  FastFieldValuePrinter *pFVar4;
  reference ppMVar5;
  Printer *pPVar6;
  ulong uVar7;
  size_type sVar8;
  FieldDescriptor *in_RCX;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  *in_RSI;
  MessageFactory *in_RDI;
  char (*in_R8) [3];
  TextGenerator *unaff_retaddr;
  Reflection *in_stack_00000008;
  Printer *in_stack_00000010;
  int j_1;
  Message *sub_message;
  FastFieldValuePrinter *printer;
  int field_index;
  int j;
  bool is_map;
  bool need_release;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  DynamicMessageFactory factory;
  int count;
  FieldDescriptor *in_stack_00000128;
  Reflection *in_stack_00000130;
  Message *in_stack_00000138;
  Printer *in_stack_00000140;
  char (*text) [3];
  FieldDescriptor *in_stack_fffffffffffffee0;
  FieldDescriptor *in_stack_fffffffffffffee8;
  Printer *in_stack_fffffffffffffef0;
  Printer *in_stack_fffffffffffffef8;
  Printer *in_stack_ffffffffffffff00;
  Printer *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  uint local_d8;
  int local_c4;
  FieldDescriptor *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff5c;
  FieldDescriptor *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  byte bVar10;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Message *in_stack_ffffffffffffff78;
  Printer *in_stack_ffffffffffffff80;
  TextGenerator *in_stack_ffffffffffffff90;
  uint local_2c;
  MessageFactory *factory_00;
  
  factory_00 = in_RDI;
  if ((((((ulong)in_RDI->_vptr_MessageFactory & 0x1000000000000) != 0) &&
       (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x44883f), bVar1)) &&
      (CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x448852), CVar3 != CPPTYPE_STRING)) &&
     (CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x448864), CVar3 != CPPTYPE_MESSAGE)) {
    PrintShortRepeatedField
              ((Printer *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               (Message *)in_stack_ffffffffffffff08,(Reflection *)in_stack_ffffffffffffff00,
               (FieldDescriptor *)in_stack_fffffffffffffef8,
               (TextGenerator *)in_stack_fffffffffffffef0);
    return;
  }
  local_2c = 0;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4488b0);
  if (bVar1) {
    local_2c = Reflection::FieldSize
                         ((Reflection *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (Message *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
  }
  else {
    bVar1 = Reflection::HasField
                      ((Reflection *)in_stack_fffffffffffffef8,(Message *)in_stack_fffffffffffffef0,
                       in_stack_fffffffffffffee8);
    if (!bVar1) {
      this_00 = FieldDescriptor::containing_type(in_RCX);
      Descriptor::options(this_00);
      bVar1 = MessageOptions::map_entry((MessageOptions *)0x44891a);
      if (!bVar1) goto LAB_0044892d;
    }
    local_2c = 1;
  }
LAB_0044892d:
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)in_stack_ffffffffffffff00);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)0x448947);
  bVar10 = 0;
  bVar2 = FieldDescriptor::is_map(in_stack_fffffffffffffee0);
  if ((bool)bVar2) {
    bVar10 = internal::MapFieldPrinterHelper::SortMap
                       ((Message *)in_stack_00000010,in_stack_00000008,
                        (FieldDescriptor *)unaff_retaddr,factory_00,in_RSI);
  }
  for (uVar9 = 0; (int)uVar9 < (int)local_2c; uVar9 = uVar9 + 1) {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x448a1a);
    local_d8 = uVar9;
    if (!bVar1) {
      local_d8 = 0xffffffff;
    }
    text = in_R8;
    PrintFieldName(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                   in_stack_ffffffffffffff70,
                   (Reflection *)CONCAT17(bVar10,CONCAT16(bVar2,in_stack_ffffffffffffff68)),
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff90);
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x448a94);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pFVar4 = GetFieldPrinter(in_stack_ffffffffffffff00,
                               (FieldDescriptor *)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff17 = FieldDescriptor::is_repeated((FieldDescriptor *)0x448ad7);
      if ((bool)in_stack_ffffffffffffff17) {
        if ((bVar2 & 1) == 0) {
          pPVar6 = (Printer *)
                   Reflection::GetRepeatedMessage
                             ((Reflection *)in_stack_fffffffffffffef8,
                              (Message *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                              (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          in_stack_ffffffffffffff00 = pPVar6;
          in_stack_ffffffffffffff08 = pPVar6;
        }
        else {
          ppMVar5 = std::
                    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    ::operator[]((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                  *)&stack0xffffffffffffff70,(long)(int)uVar9);
          pPVar6 = (Printer *)*ppMVar5;
          in_stack_ffffffffffffff08 = pPVar6;
        }
      }
      else {
        in_stack_fffffffffffffef0 =
             (Printer *)
             Reflection::GetMessage
                       ((Reflection *)in_stack_ffffffffffffff08,(Message *)in_stack_ffffffffffffff00
                        ,(FieldDescriptor *)in_stack_fffffffffffffef8,
                        (MessageFactory *)in_stack_fffffffffffffef0);
        pPVar6 = in_stack_fffffffffffffef0;
      }
      in_stack_fffffffffffffef8 = pPVar6;
      (*pFVar4->_vptr_FastFieldValuePrinter[0xe])
                (pFVar4,pPVar6,(ulong)local_d8,(ulong)local_2c,
                 (ulong)(*(byte *)((long)&in_RDI->_vptr_MessageFactory + 4) & 1),in_R8);
      (**(code **)(*(long *)in_R8 + 0x10))();
      Print(in_stack_00000010,(Message *)in_stack_00000008,unaff_retaddr);
      (**(code **)(*(long *)in_R8 + 0x18))();
      (*pFVar4->_vptr_FastFieldValuePrinter[0xf])
                (pFVar4,pPVar6,(ulong)local_d8,(ulong)local_2c,
                 (ulong)(*(byte *)((long)&in_RDI->_vptr_MessageFactory + 4) & 1),in_R8);
    }
    else {
      BaseTextGenerator::PrintLiteral<3ul>((BaseTextGenerator *)in_stack_fffffffffffffee0,text);
      PrintFieldValue(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128,
                      this._4_4_,(TextGenerator *)message);
      if (((ulong)in_RDI->_vptr_MessageFactory & 0x100000000) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffee0,(char (*) [2])text);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffee0,(char (*) [2])text);
      }
    }
  }
  if ((bVar10 & 1) != 0) {
    local_c4 = 0;
    while( true ) {
      uVar7 = (ulong)local_c4;
      sVar8 = std::
              vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ::size((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      *)&stack0xffffffffffffff70);
      if (sVar8 <= uVar7) break;
      ppMVar5 = std::
                vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                ::operator[]((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                              *)&stack0xffffffffffffff70,(long)local_c4);
      if (*ppMVar5 != (value_type)0x0) {
        (*((*ppMVar5)->super_MessageLite)._vptr_MessageLite[1])();
      }
      local_c4 = local_c4 + 1;
    }
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)in_stack_fffffffffffffef0);
  DynamicMessageFactory::~DynamicMessageFactory
            ((DynamicMessageFactory *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10))
  ;
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  DynamicMessageFactory factory;
  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &factory, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      Print(sub_message, generator);
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintLiteral(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (int j = 0; j < sorted_map_field.size(); ++j) {
      delete sorted_map_field[j];
    }
  }
}